

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBUnattenuateRow_SSE2(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  do {
    auVar26 = *(undefined1 (*) [16])src_argb;
    auVar24._0_14_ = auVar26._0_14_;
    auVar24[0xe] = auVar26[7];
    auVar24[0xf] = auVar26[7];
    auVar23._14_2_ = auVar24._14_2_;
    auVar23._0_13_ = auVar26._0_13_;
    auVar23[0xd] = auVar26[6];
    auVar22._13_3_ = auVar23._13_3_;
    auVar22._0_12_ = auVar26._0_12_;
    auVar22[0xc] = auVar26[6];
    auVar21._12_4_ = auVar22._12_4_;
    auVar21._0_11_ = auVar26._0_11_;
    auVar21[0xb] = auVar26[5];
    auVar20._11_5_ = auVar21._11_5_;
    auVar20._0_10_ = auVar26._0_10_;
    auVar20[10] = auVar26[5];
    auVar19._10_6_ = auVar20._10_6_;
    auVar19._0_9_ = auVar26._0_9_;
    auVar19[9] = auVar26[4];
    auVar29._9_7_ = auVar19._9_7_;
    auVar29._0_8_ = auVar26._0_8_;
    auVar29[8] = auVar26[4];
    auVar27._8_8_ = auVar29._8_8_;
    auVar27[7] = auVar26[3];
    auVar27[6] = auVar26[3];
    auVar27[5] = auVar26[2];
    auVar27[4] = auVar26[2];
    auVar27[3] = auVar26[1];
    auVar27[2] = auVar26[1];
    auVar27[0] = auVar26[0];
    auVar27[1] = auVar27[0];
    auVar26 = pshuflw(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[3]]),
                      ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[3]]),0x40);
    auVar29 = pshuflw(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[7]]),
                      ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[7]]),0x40);
    auVar26._8_8_ = auVar29._0_8_;
    auVar26 = pmulhuw(auVar27,auVar26);
    auVar25[1] = (*(undefined1 (*) [16])src_argb)[8];
    auVar25[0] = (*(undefined1 (*) [16])src_argb)[8];
    auVar25[2] = (*(undefined1 (*) [16])src_argb)[9];
    auVar25[3] = (*(undefined1 (*) [16])src_argb)[9];
    auVar25[4] = (*(undefined1 (*) [16])src_argb)[10];
    auVar25[5] = (*(undefined1 (*) [16])src_argb)[10];
    auVar25[6] = (*(undefined1 (*) [16])src_argb)[0xb];
    auVar25[7] = (*(undefined1 (*) [16])src_argb)[0xb];
    auVar25[8] = (*(undefined1 (*) [16])src_argb)[0xc];
    auVar25[9] = (*(undefined1 (*) [16])src_argb)[0xc];
    auVar25[10] = (*(undefined1 (*) [16])src_argb)[0xd];
    auVar25[0xb] = (*(undefined1 (*) [16])src_argb)[0xd];
    auVar25[0xc] = (*(undefined1 (*) [16])src_argb)[0xe];
    auVar25[0xd] = (*(undefined1 (*) [16])src_argb)[0xe];
    auVar25[0xe] = (*(undefined1 (*) [16])src_argb)[0xf];
    auVar25[0xf] = (*(undefined1 (*) [16])src_argb)[0xf];
    auVar27 = pshuflw(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[0xb]]),
                      ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[0xb]]),0x40);
    auVar29 = pshuflw(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[0xf]]),
                      ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [16])src_argb)[0xf]]),0x40);
    auVar28._0_8_ = auVar27._0_8_;
    auVar28._8_8_ = auVar29._0_8_;
    auVar27 = pmulhuw(auVar25,auVar28);
    src_argb = (uint8_t *)((long)src_argb + 0x10);
    sVar2 = auVar26._0_2_;
    sVar3 = auVar26._2_2_;
    sVar4 = auVar26._4_2_;
    sVar5 = auVar26._6_2_;
    sVar6 = auVar26._8_2_;
    sVar7 = auVar26._10_2_;
    sVar8 = auVar26._12_2_;
    sVar9 = auVar26._14_2_;
    sVar10 = auVar27._0_2_;
    sVar11 = auVar27._2_2_;
    sVar12 = auVar27._4_2_;
    sVar13 = auVar27._6_2_;
    sVar14 = auVar27._8_2_;
    sVar15 = auVar27._10_2_;
    sVar16 = auVar27._12_2_;
    sVar17 = auVar27._14_2_;
    *dst_argb = (0 < sVar2) * (sVar2 < 0x100) * auVar26[0] - (0xff < sVar2);
    dst_argb[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar26[2] - (0xff < sVar3);
    dst_argb[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar26[4] - (0xff < sVar4);
    dst_argb[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar26[6] - (0xff < sVar5);
    dst_argb[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar26[8] - (0xff < sVar6);
    dst_argb[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar26[10] - (0xff < sVar7);
    dst_argb[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar26[0xc] - (0xff < sVar8);
    dst_argb[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar26[0xe] - (0xff < sVar9);
    dst_argb[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar27[0] - (0xff < sVar10);
    dst_argb[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar27[2] - (0xff < sVar11);
    dst_argb[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar27[4] - (0xff < sVar12);
    dst_argb[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar27[6] - (0xff < sVar13);
    dst_argb[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar27[8] - (0xff < sVar14);
    dst_argb[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar27[10] - (0xff < sVar15);
    dst_argb[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar27[0xc] - (0xff < sVar16);
    dst_argb[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar27[0xe] - (0xff < sVar17);
    dst_argb = dst_argb + 0x10;
    iVar18 = width + -4;
    bVar1 = 3 < width;
    width = iVar18;
  } while (iVar18 != 0 && bVar1);
  return;
}

Assistant:

void ARGBUnattenuateRow_SSE2(const uint8_t* src_argb,
                             uint8_t* dst_argb,
                             int width) {
  uintptr_t alpha;
  asm volatile(
      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movzb       0x03(%0),%3                   \n"
      "punpcklbw   %%xmm0,%%xmm0                 \n"
      "movd        0x00(%4,%3,4),%%xmm2          \n"
      "movzb       0x07(%0),%3                   \n"
      "movd        0x00(%4,%3,4),%%xmm3          \n"
      "pshuflw     $0x40,%%xmm2,%%xmm2           \n"
      "pshuflw     $0x40,%%xmm3,%%xmm3           \n"
      "movlhps     %%xmm3,%%xmm2                 \n"
      "pmulhuw     %%xmm2,%%xmm0                 \n"
      "movdqu      (%0),%%xmm1                   \n"
      "movzb       0x0b(%0),%3                   \n"
      "punpckhbw   %%xmm1,%%xmm1                 \n"
      "movd        0x00(%4,%3,4),%%xmm2          \n"
      "movzb       0x0f(%0),%3                   \n"
      "movd        0x00(%4,%3,4),%%xmm3          \n"
      "pshuflw     $0x40,%%xmm2,%%xmm2           \n"
      "pshuflw     $0x40,%%xmm3,%%xmm3           \n"
      "movlhps     %%xmm3,%%xmm2                 \n"
      "pmulhuw     %%xmm2,%%xmm1                 \n"
      "lea         0x10(%0),%0                   \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),     // %0
        "+r"(dst_argb),     // %1
        "+r"(width),        // %2
        "=&r"(alpha)        // %3
      : "r"(fixed_invtbl8)  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}